

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

bool vkt::pipeline::anon_unknown_0::validateResultImage
               (TestTexture *texture,VkImageViewType imageViewType,
               VkImageSubresourceRange *subresource,Sampler *sampler,
               VkComponentMapping *componentMapping,ConstPixelBufferAccess *coordAccess,
               Vec2 *lodBounds,LookupPrecision *lookupPrecision,Vec4 *lookupScale,Vec4 *lookupBias,
               ConstPixelBufferAccess *resultAccess,PixelBufferAccess *errorAccess)

{
  float *pfVar1;
  undefined8 *puVar2;
  int *piVar3;
  deUint32 numLevels;
  Texture1DView *pTVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  Texture3DView *this;
  Texture1DArrayView *this_00;
  Texture2DArrayView *this_01;
  TextureCubeArrayView *this_02;
  TextureCubeView *this_03;
  Texture3D *this_04;
  Texture1D *this_05;
  Texture2D *this_06;
  Texture1DArray *this_07;
  Texture2DArray *this_08;
  TextureCubeArray *this_09;
  TextureCube *this_10;
  long lVar11;
  int levelNdx;
  pointer pCVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int x_00;
  ConstPixelBufferAccess *pCVar16;
  int x_7;
  long lVar17;
  int x;
  int iVar18;
  long lVar19;
  int levelNdx_4;
  uint uVar20;
  Vec4 texCoord_7;
  UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> texView;
  Vec4 resultPixel;
  ConstPixelBufferAccess *local_e8;
  ConstPixelBufferAccess *pCStack_e0;
  ConstPixelBufferAccess *local_d8;
  UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> swizzledTex;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levels;
  Vec4 texCoord;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vec4 resultColor;
  undefined8 local_48;
  int aiStack_40 [2];
  void *local_38;
  int x_01;
  
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x_00 = (int)resultAccess;
  x_01 = (int)coordAccess;
  switch(imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    lVar19 = 0;
    lVar17 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      iVar13 = (int)(((long)levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0x28);
      if (iVar13 <= lVar17) break;
      (*texture->_vptr_TestTexture[8])
                ((ConstPixelBufferAccess *)&resultPixel,texture,
                 (ulong)(subresource->baseMipLevel + (int)lVar17));
      tcu::getSubregion((ConstPixelBufferAccess *)&resultColor,
                        (ConstPixelBufferAccess *)&resultPixel,0,0,0,(int)resultPixel.m_data[2],1,1)
      ;
      *(void **)((long)(&(levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar19) =
           local_38;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar19 + 8);
      *puVar2 = local_48;
      puVar2[1] = aiStack_40;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar19 + -8);
      *(undefined8 *)pfVar1 = resultColor.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultColor.m_data._8_8_;
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0x28;
      pCVar12 = levels.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)operator_new(0x10);
    (texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.
    ptr)->m_numLevels = iVar13;
    (texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.
    ptr)->m_levels = pCVar12;
    texCoord.m_data[0] = 0.0;
    texCoord.m_data[1] = 0.0;
    de::details::UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *)&texCoord
               );
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = tcu::isLookupResultValid
                            (pTVar4,sampler,lookupPrecision,texCoord.m_data[0],lodBounds,
                             &resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_05 = (Texture1D *)operator_new(0x50);
      tcu::Texture1D::Texture1D(this_05,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_05;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::Texture1D::allocLevel(this_05,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_05->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniqueBase
                ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x48);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x40);
          bVar7 = tcu::isLookupResultValid
                            ((Texture1DView *)&texCoord_7,sampler,lookupPrecision,texCoord.m_data[0]
                             ,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniqueBase
                (&swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>)
      ;
    }
    de::details::UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::
    ~UniqueBase(&texView.
                 super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>);
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
    plVar9 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar8 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    lVar17 = 0;
    lVar19 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      iVar13 = (int)(((long)levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0x28);
      if (iVar13 <= lVar19) break;
      if (plVar9 == (long *)0x0) {
        lVar10 = (**(code **)(*plVar8 + 0x80))();
      }
      else {
        lVar10 = (**(code **)(*plVar9 + 0x80))(plVar9);
      }
      lVar10 = *(long *)(lVar10 + 0x20);
      lVar11 = (long)(int)(subresource->baseMipLevel + (int)lVar19) * 0x28;
      tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,
                        (ConstPixelBufferAccess *)(lVar10 + lVar11),0,0,subresource->baseArrayLayer,
                        *(int *)(lVar10 + 8 + lVar11),*(int *)(lVar10 + 0xc + lVar11),1);
      *(ConstPixelBufferAccess **)
       ((long)(&(levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar17) = local_d8;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar17 + 8);
      *puVar2 = local_e8;
      puVar2[1] = pCStack_e0;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar17 + -8);
      *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x28;
      pCVar12 = levels.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)operator_new(0x10);
    (texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.
    ptr)->m_numLevels = iVar13;
    (texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.
    ptr)->m_levels = pCVar12;
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    de::details::UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)
                &resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((Texture2DView *)pTVar4,sampler,lookupPrecision,&texCoord,
                                      lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_06 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D
                (this_06,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0],
                 (pCVar16->m_size).m_data[1]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_06;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::Texture2D::allocLevel(this_06,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_06->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x48);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x40);
          bVar7 = isLookupResultValid((Texture2DView *)&texCoord_7,sampler,lookupPrecision,&texCoord
                                      ,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&swizzledTex);
    }
    de::details::UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)&texView)
    ;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    lVar17 = 0;
    lVar19 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      iVar13 = (int)(((long)levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0x28);
      if (iVar13 <= lVar19) break;
      (*texture->_vptr_TestTexture[8])
                (&resultPixel,texture,(ulong)(subresource->baseMipLevel + (int)lVar19),
                 (ulong)subresource->baseArrayLayer);
      *(ConstPixelBufferAccess **)
       ((long)(&(levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar17) = local_d8;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar17 + 8);
      *puVar2 = local_e8;
      puVar2[1] = pCStack_e0;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar17 + -8);
      *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x28;
      pCVar12 = levels.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    this = (Texture3DView *)operator_new(0x10);
    tcu::Texture3DView::Texture3DView(this,iVar13,pCVar12);
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)this;
    de::details::UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)
                &resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((Texture3DView *)pTVar4,sampler,lookupPrecision,&texCoord,
                                      lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_04 = (Texture3D *)operator_new(0x58);
      tcu::Texture3D::Texture3D
                (this_04,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0],
                 (pCVar16->m_size).m_data[1],(pCVar16->m_size).m_data[2]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_04;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::Texture3D::allocLevel(this_04,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_04->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~UniqueBase
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x50);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x48);
          bVar7 = isLookupResultValid((Texture3DView *)&texCoord_7,sampler,lookupPrecision,&texCoord
                                      ,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~UniqueBase
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&swizzledTex);
    }
    de::details::UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)&texView)
    ;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    plVar9 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCube::typeinfo,0);
    plVar8 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,0
                                   );
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)(subresource->levelCount * 6));
    for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
      lVar10 = 0;
      for (lVar19 = 0; lVar19 < (int)subresource->levelCount; lVar19 = lVar19 + 1) {
        if (plVar8 == (long *)0x0) {
          lVar11 = (**(code **)(*plVar9 + 0x80))(plVar9);
          pCVar16 = (ConstPixelBufferAccess *)
                    (*(long *)(lVar11 + 0xa0 +
                              (ulong)(uint)(&pipeline::(anonymous_namespace)::
                                             getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                                             ::s_faceMap)[lVar17] * 0x18) + lVar10);
          iVar13 = 0;
        }
        else {
          lVar11 = (**(code **)(*plVar8 + 0x80))(plVar8);
          pCVar16 = (ConstPixelBufferAccess *)
                    ((long)(int)(subresource->baseMipLevel + (int)lVar19) * 0x28 +
                    *(long *)(lVar11 + 0x20));
          iVar13 = (int)lVar17;
        }
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar16,0,0,
                          iVar13 + subresource->baseArrayLayer,(pCVar16->m_size).m_data[0],
                          (pCVar16->m_size).m_data[1],1);
        uVar20 = subresource->levelCount * (int)lVar17 + (int)lVar19;
        levels.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar20].m_data = local_d8;
        piVar3 = levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20].m_size.m_data + 2;
        *(ConstPixelBufferAccess **)piVar3 = local_e8;
        *(ConstPixelBufferAccess **)(piVar3 + 2) = pCStack_e0;
        pCVar12 = levels.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar20;
        (pCVar12->m_format).order = (ChannelOrder)resultPixel.m_data[0];
        (pCVar12->m_format).type = (ChannelType)resultPixel.m_data[1];
        *(undefined8 *)(pCVar12->m_size).m_data = resultPixel.m_data._8_8_;
        lVar10 = lVar10 + 0x28;
      }
    }
    numLevels = subresource->levelCount;
    uVar20 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 4) {
      *(pointer *)
       (resultPixel.m_data +
       (ulong)*(uint *)((long)&pipeline::(anonymous_namespace)::
                               getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                               ::s_faceMap + lVar17) * 2) = pCVar12 + uVar20;
      uVar20 = uVar20 + numLevels;
    }
    this_03 = (TextureCubeView *)operator_new(0x38);
    tcu::TextureCubeView::TextureCubeView
              (this_03,numLevels,(ConstPixelBufferAccess *(*) [6])&resultPixel);
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)this_03;
    de::details::UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
                &resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((TextureCubeView *)pTVar4,sampler,lookupPrecision,&texCoord,
                                      lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      this_10 = (TextureCube *)operator_new(0x168);
      resultColor.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      if (pTVar4->m_numLevels < 1) {
        iVar13 = 0;
      }
      else {
        iVar13 = (pTVar4->m_levels->m_size).m_data[0];
      }
      tcu::TextureCube::TextureCube(this_10,(TextureFormat *)&resultColor,iVar13);
      resultPixel.m_data._0_8_ = this_10;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 != 6; lVar17 = lVar17 + 1) {
        lVar19 = 0;
        for (lVar10 = 0; lVar10 < pTVar4->m_numLevels; lVar10 = lVar10 + 1) {
          tcu::TextureCube::allocLevel(this_10,(CubeFace)lVar17,(int)lVar10);
          swizzle((ConstPixelBufferAccess *)
                  ((long)((&pTVar4->m_levels)[lVar17]->m_size).m_data + lVar19 + -8),
                  (PixelBufferAccess *)
                  ((long)((this_10->m_access[lVar17].
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess)
                         .m_size.m_data + lVar19 + -8),componentMapping);
          lVar19 = lVar19 + 0x28;
        }
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniqueBase
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&resultPixel
                );
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultColor,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&resultPixel,&resultColor,&local_78);
          tcu::operator/((tcu *)&texCoord,(Vector<float,_4> *)&resultPixel,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord_7,x_01,iVar18,iVar15);
          resultPixel.m_data._0_8_ = *(undefined8 *)(uVar5 + 0x130);
          resultPixel.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x138);
          bVar7 = isLookupResultValid((TextureCubeView *)&resultPixel,sampler,lookupPrecision,
                                      &texCoord_7,lodBounds,&texCoord);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          resultPixel.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          resultPixel.m_data[2] = 0.0;
          resultPixel.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniqueBase
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&swizzledTex
                );
    }
    de::details::UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
                &texView);
    break;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    plVar8 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1D::typeinfo,0);
    plVar9 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1DArray::typeinfo,0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    if (plVar8 != (long *)0x0) {
      plVar9 = plVar8;
    }
    lVar17 = 0;
    lVar19 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      iVar13 = (int)(((long)levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0x28);
      if (iVar13 <= lVar19) break;
      lVar10 = (**(code **)(*plVar9 + 0x80))(plVar9);
      lVar11 = (long)(int)(subresource->baseMipLevel + (int)lVar19) * 0x28;
      tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,
                        (ConstPixelBufferAccess *)(*(long *)(lVar10 + 0x20) + lVar11),0,
                        subresource->baseArrayLayer,0,
                        *(int *)(*(long *)(lVar10 + 0x20) + 8 + lVar11),subresource->layerCount,1);
      *(ConstPixelBufferAccess **)
       ((long)(&(levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar17) = local_d8;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar17 + 8);
      *puVar2 = local_e8;
      puVar2[1] = pCStack_e0;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar17 + -8);
      *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x28;
      pCVar12 = levels.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    this_00 = (Texture1DArrayView *)operator_new(0x10);
    tcu::Texture1DArrayView::Texture1DArrayView(this_00,iVar13,pCVar12);
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)this_00;
    de::details::UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *
                )&resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((Texture1DArrayView *)pTVar4,sampler,lookupPrecision,&texCoord
                                      ,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_07 = (Texture1DArray *)operator_new(0x50);
      tcu::Texture1DArray::Texture1DArray
                (this_07,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0],
                 (pCVar16->m_size).m_data[1]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_07;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::Texture1DArray::allocLevel(this_07,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_07->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
      ~UniqueBase((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                  &resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x48);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x40);
          bVar7 = isLookupResultValid((Texture1DArrayView *)&texCoord_7,sampler,lookupPrecision,
                                      &texCoord,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
      ~UniqueBase((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                  &swizzledTex);
    }
    de::details::UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *
                )&texView);
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    plVar9 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar8 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    lVar17 = 0;
    lVar19 = 0;
    pCVar12 = levels.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      iVar13 = (int)(((long)levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0x28);
      if (iVar13 <= lVar19) break;
      if (plVar9 == (long *)0x0) {
        lVar10 = (**(code **)(*plVar8 + 0x80))();
      }
      else {
        lVar10 = (**(code **)(*plVar9 + 0x80))(plVar9);
      }
      lVar10 = *(long *)(lVar10 + 0x20);
      lVar11 = (long)(int)(subresource->baseMipLevel + (int)lVar19) * 0x28;
      tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,
                        (ConstPixelBufferAccess *)(lVar10 + lVar11),0,0,subresource->baseArrayLayer,
                        *(int *)(lVar10 + 8 + lVar11),*(int *)(lVar10 + 0xc + lVar11),
                        subresource->layerCount);
      *(ConstPixelBufferAccess **)
       ((long)(&(levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar17) = local_d8;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar17 + 8);
      *puVar2 = local_e8;
      puVar2[1] = pCStack_e0;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar17 + -8);
      *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x28;
      pCVar12 = levels.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    this_01 = (Texture2DArrayView *)operator_new(0x10);
    tcu::Texture2DArrayView::Texture2DArrayView(this_01,iVar13,pCVar12);
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)this_01;
    de::details::UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *
                )&resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((Texture2DArrayView *)pTVar4,sampler,lookupPrecision,&texCoord
                                      ,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_08 = (Texture2DArray *)operator_new(0x58);
      tcu::Texture2DArray::Texture2DArray
                (this_08,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0],
                 (pCVar16->m_size).m_data[1],(pCVar16->m_size).m_data[2]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_08;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::Texture2DArray::allocLevel(this_08,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_08->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
      ~UniqueBase((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                  &resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x50);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x48);
          bVar7 = isLookupResultValid((Texture2DArrayView *)&texCoord_7,sampler,lookupPrecision,
                                      &texCoord,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
      ~UniqueBase((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                  &swizzledTex);
    }
    de::details::UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *
                )&texView);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    plVar9 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,0
                                   );
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    lVar17 = 0;
    for (lVar19 = 0; lVar19 < (int)subresource->levelCount; lVar19 = lVar19 + 1) {
      lVar10 = (**(code **)(*plVar9 + 0x80))(plVar9);
      lVar10 = *(long *)(lVar10 + 0x20);
      lVar11 = (long)(int)(subresource->baseMipLevel + (int)lVar19) * 0x28;
      tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,
                        (ConstPixelBufferAccess *)(lVar10 + lVar11),0,0,subresource->baseArrayLayer,
                        *(int *)(lVar10 + 8 + lVar11),*(int *)(lVar10 + 0xc + lVar11),
                        subresource->layerCount);
      *(ConstPixelBufferAccess **)
       ((long)(&(levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar17) = local_d8;
      puVar2 = (undefined8 *)
               ((long)((levels.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar17 + 8);
      *puVar2 = local_e8;
      puVar2[1] = pCStack_e0;
      pfVar1 = (float *)((long)((levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                        lVar17 + -8);
      *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
      *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
      lVar17 = lVar17 + 0x28;
    }
    this_02 = (TextureCubeArrayView *)operator_new(0x10);
    tcu::TextureCubeArrayView::TextureCubeArrayView
              (this_02,(int)(((long)levels.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28),
               levels.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    resultColor.m_data[0] = 0.0;
    resultColor.m_data[1] = 0.0;
    texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data.ptr
         = (Texture1DView *)this_02;
    de::details::
    UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                 *)&resultColor);
    pTVar4 = texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
             m_data.ptr;
    bVar6 = isIdentitySwizzle(componentMapping);
    if (bVar6) {
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (resultAccess->m_size).m_data[1];
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar6 = true;
      for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar14);
          tcu::operator-((tcu *)&texCoord,&resultPixel,lookupBias);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,lookupScale);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar14);
          bVar7 = isLookupResultValid((TextureCubeArrayView *)pTVar4,sampler,lookupPrecision,
                                      &texCoord,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar14,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
    }
    else {
      resultPixel.m_data._0_8_ = getSwizzleTargetFormat(pTVar4->m_levels->m_format);
      pCVar16 = pTVar4->m_levels;
      this_09 = (TextureCubeArray *)operator_new(0x50);
      tcu::TextureCubeArray::TextureCubeArray
                (this_09,(TextureFormat *)&resultPixel,(pCVar16->m_size).m_data[0],
                 (pCVar16->m_size).m_data[2]);
      lVar19 = 0;
      resultPixel.m_data._0_8_ = this_09;
      for (lVar17 = 0; uVar5 = resultPixel.m_data._0_8_, lVar17 < pTVar4->m_numLevels;
          lVar17 = lVar17 + 1) {
        tcu::TextureCubeArray::allocLevel(this_09,(int)lVar17);
        swizzle((ConstPixelBufferAccess *)((long)(pTVar4->m_levels->m_size).m_data + lVar19 + -8),
                (PixelBufferAccess *)
                ((long)(((this_09->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                       m_size.m_data + lVar19 + -8),componentMapping);
        lVar19 = lVar19 + 0x28;
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar5;
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      ~UniqueBase((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
                  &resultPixel);
      swizzleScaleBias((anon_unknown_0 *)&local_68,lookupScale,componentMapping);
      swizzleScaleBias((anon_unknown_0 *)&local_78,lookupBias,componentMapping);
      iVar13 = (resultAccess->m_size).m_data[0];
      iVar14 = (resultAccess->m_size).m_data[1];
      iVar15 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      bVar6 = true;
      for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
        for (iVar18 = 0; iVar13 != iVar18; iVar18 = iVar18 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,x_00,iVar18,iVar15);
          tcu::operator-((tcu *)&texCoord,&resultPixel,&local_78);
          tcu::operator/((tcu *)&resultColor,(Vector<float,_4> *)&texCoord,&local_68);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&texCoord,x_01,iVar18,iVar15);
          texCoord_7.m_data._8_8_ = *(undefined8 *)(uVar5 + 0x48);
          texCoord_7.m_data[0] = *(float *)(uVar5 + 0x40);
          bVar7 = isLookupResultValid((TextureCubeArrayView *)&texCoord_7,sampler,lookupPrecision,
                                      &texCoord,lodBounds,&resultColor);
          uVar20 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
          texCoord_7.m_data._0_8_ =
               ~CONCAT44(uVar20,(int)((uint)bVar7 << 0x1f) >> 0x1f) & SUB168(ZEXT416(0x3f800000),0)
               | ((ulong)uVar20 & 0x3f800000) << 0x20;
          texCoord_7.m_data[2] = 0.0;
          texCoord_7.m_data[3] = 1.0;
          tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar18,iVar15,0);
          bVar6 = (bool)(bVar6 & bVar7);
        }
      }
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      ~UniqueBase((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
                  &swizzledTex);
    }
    de::details::
    UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                 *)&texView);
    break;
  default:
    bVar6 = false;
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&levels.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               );
  return bVar6;
}

Assistant:

bool validateResultImage (const TestTexture&					texture,
						  const VkImageViewType					imageViewType,
						  const VkImageSubresourceRange&		subresource,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			componentMapping,
						  const tcu::ConstPixelBufferAccess&	coordAccess,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	resultAccess,
						  const tcu::PixelBufferAccess&			errorAccess)
{
	std::vector<tcu::ConstPixelBufferAccess>	levels;

	switch (imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		{
			UniquePtr<tcu::Texture1DView>			texView(getTexture1DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		{
			UniquePtr<tcu::Texture1DArrayView>		texView(getTexture1DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D:
		{
			UniquePtr<tcu::Texture2DView>			texView(getTexture2DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		{
			UniquePtr<tcu::Texture2DArrayView>		texView(getTexture2DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE:
		{
			UniquePtr<tcu::TextureCubeView>			texView(getTextureCubeView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			UniquePtr<tcu::TextureCubeArrayView>	texView(getTextureCubeArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
			break;
		}

		case VK_IMAGE_VIEW_TYPE_3D:
		{
			UniquePtr<tcu::Texture3DView>			texView(getTexture3DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		default:
			DE_ASSERT(false);
			return false;
	}
}